

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool Dump3dmChunk_EndReadChunkHelper
               (ON_BinaryArchive *file,ON__UINT64 offset0,ON__UINT32 tcode,ON__INT64 big_value,
               ON_TextLog *dump)

{
  int iVar1;
  ON__UINT64 offset;
  size_t sVar2;
  long local_70;
  ON__INT64 extra;
  ON__INT64 delta;
  ON__INT64 sizeof_chunk_header;
  ON__INT64 sizeof_crc;
  bool rc;
  ON__UINT64 offset1;
  bool bShortChunk;
  ON_TextLog *dump_local;
  ON__INT64 big_value_local;
  ON__UINT32 tcode_local;
  ON__UINT64 offset0_local;
  ON_BinaryArchive *file_local;
  
  offset = ON_BinaryArchive::CurrentPosition(file);
  sizeof_crc._7_1_ = ON_BinaryArchive::EndRead3dmChunk(file);
  if (sizeof_crc._7_1_) {
    if ((tcode & 0x80000000) == 0) {
      iVar1 = 0;
      if ((tcode & 0x8000) != 0) {
        iVar1 = 4;
      }
      sVar2 = ON_BinaryArchive::SizeofChunkLength(file);
      if (offset0 < offset) {
        local_70 = offset - offset0;
      }
      else {
        local_70 = -(offset0 - offset);
      }
      if ((long)(big_value - ((local_70 + iVar1) - (sVar2 + 4))) < 0) {
        Dump3dmChunk_ErrorReportHelper(offset0,"Read beyond end of chunk.",dump);
        sizeof_crc._7_1_ = false;
      }
    }
  }
  else {
    Dump3dmChunk_ErrorReportHelper(offset,"EndRead3dmChunk() failed.",dump);
  }
  return sizeof_crc._7_1_;
}

Assistant:

static
bool Dump3dmChunk_EndReadChunkHelper( ON_BinaryArchive& file, ON__UINT64 offset0, ON__UINT32 tcode, ON__INT64 big_value, ON_TextLog& dump )
{
  const bool bShortChunk = (0 != (tcode & TCODE_SHORT));
  const ON__UINT64 offset1 = file.CurrentPosition();
  bool rc = file.EndRead3dmChunk();
  if ( !rc ) 
  {
    Dump3dmChunk_ErrorReportHelper(offset1,"EndRead3dmChunk() failed.",dump);
  }
  else if (!bShortChunk) 
  {
    // The crc is read or skipped by the EndRead3dmChunk() call.
    // "extra" is the number of bytes we did not parse in the dump.
    ON__INT64 sizeof_crc = (0 != (TCODE_CRC & tcode)) ? 4 : 0;
    ON__INT64 sizeof_chunk_header = 4+file.SizeofChunkLength();
    ON__INT64 delta =  (offset1 > offset0)
              ?  ((ON__INT64)(offset1 - offset0))
              : -((ON__INT64)(offset0 - offset1));
    const ON__INT64 extra = big_value - (delta+sizeof_crc-sizeof_chunk_header);
    if ( extra < 0 ) 
    {
      Dump3dmChunk_ErrorReportHelper(offset0,"Read beyond end of chunk.",dump);
      rc = false;
    }
  }
  return rc;
}